

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O0

Id dxil_spv::build_descriptor_qa_check_function(SPIRVModule *module)

{
  Builder *pBVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  DescriptorQAInfo *pDVar5;
  Block *bp;
  Function *pFVar6;
  pointer pIVar7;
  pointer pIVar8;
  Block *pBVar9;
  __uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true> this;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1b8;
  undefined4 local_1ac;
  Op local_1a8;
  Id local_1a4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1a0;
  __single_object call;
  Block *correct_block;
  Block *fault_block;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_180;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_178;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_170;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_168;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_160;
  Id local_154;
  Id local_150;
  Id fault_cond_id;
  Id fault_type_id;
  Id local_144;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_140;
  __single_object fault_cond;
  Op local_130;
  Id local_12c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_128;
  __single_object merge_check1;
  Op local_118;
  Id local_114;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_110;
  __single_object merge_check0;
  Op local_100;
  Id local_fc;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_f8;
  __single_object alive_check;
  Op local_e8;
  Id local_e4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_e0;
  __single_object type_check;
  Op local_d0;
  Id local_cc;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_c8;
  __single_object range_check;
  Id out_of_range_id;
  Id type_cond_id;
  Id live_status_cond_id;
  Id live_status_id;
  Id descriptor_info_id;
  Id cookie_mask_id;
  Id cookie_shifted_id;
  Id cookie_id;
  Id cookie_descriptor_info;
  Id heap_id;
  Id fallback_offset_id;
  Id descriptor_count_id;
  Id instruction_id;
  Id descriptor_type_id;
  Id offset_id;
  Function *local_68;
  Function *func;
  undefined1 local_58 [8];
  Vector<spv::Id> param_types;
  Block *entry;
  Block *current_build_point;
  Id heap_buffer_id;
  Id descriptor_qa_heap_buffer_id;
  Id heap_buffer_type_id;
  Id global_buffer_id;
  Id fault_func_id;
  Builder *builder;
  SPIRVModule *module_local;
  
  builder = (Builder *)module;
  _global_buffer_id = SPIRVModule::get_builder(module);
  build_descriptor_qa_fault_report
            ((SPIRVModule *)builder,&heap_buffer_type_id,&descriptor_qa_heap_buffer_id);
  IVar2 = build_descriptor_qa_heap_buffer_type(_global_buffer_id);
  IVar2 = SPIRVModule::create_variable
                    ((SPIRVModule *)builder,StorageClassStorageBuffer,IVar2,"QAHeapData");
  pBVar1 = _global_buffer_id;
  pDVar5 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)builder);
  spv::Builder::addDecoration(pBVar1,IVar2,DecorationDescriptorSet,pDVar5->heap_desc_set);
  pBVar1 = _global_buffer_id;
  pDVar5 = SPIRVModule::get_descriptor_qa_info((SPIRVModule *)builder);
  spv::Builder::addDecoration(pBVar1,IVar2,DecorationBinding,pDVar5->heap_binding);
  spv::Builder::addDecoration(_global_buffer_id,IVar2,DecorationNonWritable,-1);
  bp = spv::Builder::getBuildPoint(_global_buffer_id);
  param_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._4_4_ = spv::Builder::makeUintType(_global_buffer_id,0x20);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_58,3,
             (value_type_conflict1 *)((long)&func + 4),(allocator_type *)((long)&func + 3));
  pBVar1 = _global_buffer_id;
  IVar3 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  memset(&descriptor_type_id,0,0x18);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            *)&descriptor_type_id);
  pFVar6 = spv::Builder::makeFunctionEntry
                     (pBVar1,DecorationMax,IVar3,"descriptor_qa_check",(Vector<Id> *)local_58,
                      (Vector<dxil_spv::Vector<Decoration>_> *)&descriptor_type_id,
                      (Block **)
                      &param_types.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)&descriptor_type_id);
  local_68 = pFVar6;
  spv::Builder::setBuildPoint
            (_global_buffer_id,
             (Block *)param_types.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  instruction_id = spv::Function::getParamId(local_68,0);
  descriptor_count_id = spv::Function::getParamId(local_68,1);
  fallback_offset_id = spv::Function::getParamId(local_68,2);
  spv::Builder::addName(_global_buffer_id,instruction_id,"heap_offset");
  spv::Builder::addName(_global_buffer_id,descriptor_count_id,"descriptor_type_mask");
  spv::Builder::addName(_global_buffer_id,fallback_offset_id,"instruction");
  pBVar1 = _global_buffer_id;
  IVar3 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  cookie_descriptor_info = build_ssbo_load(pBVar1,IVar3,IVar2,0);
  pBVar1 = _global_buffer_id;
  heap_id = cookie_descriptor_info;
  IVar3 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  cookie_id = build_ssbo_load(pBVar1,IVar3,IVar2,1);
  pBVar1 = _global_buffer_id;
  IVar3 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  IVar3 = spv::Builder::makeVectorType(pBVar1,IVar3,2);
  cookie_shifted_id = build_ssbo_load_array(pBVar1,IVar3,IVar2,2,instruction_id);
  build_cookie_descriptor_info_split
            (_global_buffer_id,cookie_shifted_id,&cookie_mask_id,&descriptor_info_id,&live_status_id
             ,&live_status_cond_id);
  pBVar1 = _global_buffer_id;
  IVar2 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  IVar2 = build_ssbo_load_array(pBVar1,IVar2,descriptor_qa_heap_buffer_id,9,descriptor_info_id);
  IVar2 = build_live_check(_global_buffer_id,IVar2,live_status_id);
  pBVar1 = _global_buffer_id;
  IVar3 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  IVar3 = build_binary_op(pBVar1,IVar3,OpBitwiseAnd,live_status_cond_id,descriptor_count_id);
  pBVar1 = _global_buffer_id;
  IVar4 = spv::Builder::makeBoolType(_global_buffer_id);
  IVar3 = build_binary_op(pBVar1,IVar4,OpIEqual,IVar3,descriptor_count_id);
  pBVar1 = _global_buffer_id;
  IVar4 = spv::Builder::makeBoolType(_global_buffer_id);
  range_check._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       build_binary_op(pBVar1,IVar4,OpUGreaterThanEqual,instruction_id,heap_id);
  local_cc = spv::Builder::getUniqueId(_global_buffer_id);
  local_d0 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  type_check._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xa9;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_c8,&local_cc,&local_d0);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  spv::Instruction::addIdOperand
            (pIVar7,range_check._M_t.
                    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  IVar4 = spv::Builder::makeUintConstant(_global_buffer_id,1,false);
  spv::Instruction::addIdOperand(pIVar7,IVar4);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  IVar4 = spv::Builder::makeUintConstant(_global_buffer_id,0,false);
  spv::Instruction::addIdOperand(pIVar7,IVar4);
  local_e4 = spv::Builder::getUniqueId(_global_buffer_id);
  local_e8 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  alive_check._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xa9;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_e0,&local_e4,&local_e8);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_e0);
  spv::Instruction::addIdOperand(pIVar7,IVar3);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_e0);
  IVar3 = spv::Builder::makeUintConstant(_global_buffer_id,0,false);
  spv::Instruction::addIdOperand(pIVar7,IVar3);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_e0);
  IVar3 = spv::Builder::makeUintConstant(_global_buffer_id,2,false);
  spv::Instruction::addIdOperand(pIVar7,IVar3);
  local_fc = spv::Builder::getUniqueId(_global_buffer_id);
  local_100 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  merge_check0._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xa9;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_f8,&local_fc,&local_100);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_f8);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_f8);
  IVar2 = spv::Builder::makeUintConstant(_global_buffer_id,0,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_f8);
  IVar2 = spv::Builder::makeUintConstant(_global_buffer_id,4,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  local_114 = spv::Builder::getUniqueId(_global_buffer_id);
  local_118 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  merge_check1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xc5;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_110,&local_114,&local_118);
  local_12c = spv::Builder::getUniqueId(_global_buffer_id);
  local_130 = spv::Builder::makeUintType(_global_buffer_id,0x20);
  fault_cond._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
  _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xc5;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_128,&local_12c,&local_130);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_110);
  pIVar8 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_c8);
  IVar2 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_110);
  pIVar8 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_e0);
  IVar2 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_128);
  pIVar8 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_110);
  IVar2 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_128);
  pIVar8 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_f8);
  IVar2 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  local_144 = spv::Builder::getUniqueId(_global_buffer_id);
  fault_type_id = spv::Builder::makeBoolType(_global_buffer_id);
  fault_cond_id = 0xab;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_140,&local_144,&fault_type_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_140);
  pIVar8 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_128);
  IVar2 = spv::Instruction::getResultId(pIVar8);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_140);
  IVar2 = spv::Builder::makeUintConstant(_global_buffer_id,0,false);
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_128);
  local_150 = spv::Instruction::getResultId(pIVar7);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_140);
  local_154 = spv::Instruction::getResultId(pIVar7);
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_160,&local_c8);
  spv::Block::addInstruction(pBVar9,&local_160);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_160)
  ;
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_168,&local_e0);
  spv::Block::addInstruction(pBVar9,&local_168);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_168)
  ;
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_170,&local_f8);
  spv::Block::addInstruction(pBVar9,&local_170);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_170)
  ;
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_178,&local_110);
  spv::Block::addInstruction(pBVar9,&local_178);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_178)
  ;
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_180,&local_128);
  spv::Block::addInstruction(pBVar9,&local_180);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_180)
  ;
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&fault_block,
             &local_140);
  inst = (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&fault_block;
  spv::Block::addInstruction(pBVar9,inst);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&fault_block);
  pBVar9 = (Block *)spv::Block::operator_new((Block *)0x78,(size_t)inst);
  IVar2 = spv::Builder::getUniqueId(_global_buffer_id);
  size = (size_t)IVar2;
  spv::Block::Block(pBVar9,IVar2,local_68);
  this.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
       spv::Block::operator_new((Block *)0x78,size);
  IVar2 = spv::Builder::getUniqueId(_global_buffer_id);
  spv::Block::Block((Block *)this.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar2,
                    local_68);
  call._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
       this.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  spv::Builder::createSelectionMerge
            (_global_buffer_id,
             (Block *)this.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,0);
  spv::Builder::createConditionalBranch
            (_global_buffer_id,local_154,pBVar9,
             (Block *)call._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  spv::Builder::setBuildPoint(_global_buffer_id,pBVar9);
  local_1a4 = spv::Builder::getUniqueId(_global_buffer_id);
  local_1a8 = spv::Builder::makeVoidType(_global_buffer_id);
  local_1ac = 0x39;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
            ((uint *)&local_1a0,&local_1a4,&local_1a8);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,heap_buffer_type_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,local_150);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,instruction_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,cookie_mask_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,cookie_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,descriptor_count_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,live_status_cond_id);
  pIVar7 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_1a0);
  spv::Instruction::addIdOperand(pIVar7,fallback_offset_id);
  pBVar9 = spv::Builder::getBuildPoint(_global_buffer_id);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_1b8,&local_1a0);
  spv::Block::addInstruction(pBVar9,&local_1b8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_1b8)
  ;
  spv::Builder::makeReturn(_global_buffer_id,false,cookie_descriptor_info);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_1a0)
  ;
  spv::Builder::setBuildPoint
            (_global_buffer_id,
             (Block *)call._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  spv::Builder::makeReturn(_global_buffer_id,false,instruction_id);
  spv::Builder::setBuildPoint(_global_buffer_id,bp);
  IVar2 = spv::Function::getId(local_68);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_140)
  ;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_128)
  ;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_110)
  ;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_f8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_e0);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_c8);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_58);
  return IVar2;
}

Assistant:

spv::Id build_descriptor_qa_check_function(SPIRVModule &module)
{
	auto &builder = module.get_builder();
	spv::Id fault_func_id, global_buffer_id;
	build_descriptor_qa_fault_report(module, fault_func_id, global_buffer_id);

	spv::Id heap_buffer_type_id = build_descriptor_qa_heap_buffer_type(builder);
	spv::Id descriptor_qa_heap_buffer_id = module.create_variable(spv::StorageClassStorageBuffer,
	                                                              heap_buffer_type_id, "QAHeapData");
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationDescriptorSet,
	                      module.get_descriptor_qa_info().heap_desc_set);
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationBinding,
	                      module.get_descriptor_qa_info().heap_binding);
	builder.addDecoration(descriptor_qa_heap_buffer_id, spv::DecorationNonWritable);

	auto heap_buffer_id = descriptor_qa_heap_buffer_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;

	Vector<spv::Id> param_types(3, builder.makeUintType(32));
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeUintType(32),
	                                       "descriptor_qa_check",
	                                       param_types, {}, &entry);
	builder.setBuildPoint(entry);

	spv::Id offset_id = func->getParamId(0);
	spv::Id descriptor_type_id = func->getParamId(1);
	spv::Id instruction_id = func->getParamId(2);

	builder.addName(offset_id, "heap_offset");
	builder.addName(descriptor_type_id, "descriptor_type_mask");
	builder.addName(instruction_id, "instruction");

	spv::Id descriptor_count_id = build_ssbo_load(builder, builder.makeUintType(32), heap_buffer_id,
	                                              uint32_t(DescriptorQAHeapMembers::DescriptorCount));

	spv::Id fallback_offset_id = descriptor_count_id;

	spv::Id heap_id = build_ssbo_load(builder, builder.makeUintType(32), heap_buffer_id,
	                                  uint32_t(DescriptorQAHeapMembers::HeapIndex));
	spv::Id cookie_descriptor_info = build_ssbo_load_array(builder, builder.makeVectorType(builder.makeUintType(32), 2),
	                                                       heap_buffer_id,
	                                                       uint32_t(DescriptorQAHeapMembers::CookiesDescriptorInfo),
	                                                       offset_id);
	spv::Id cookie_id;
	spv::Id cookie_shifted_id;
	spv::Id cookie_mask_id;
	spv::Id descriptor_info_id;
	build_cookie_descriptor_info_split(builder, cookie_descriptor_info, cookie_id,
	                                   cookie_shifted_id, cookie_mask_id, descriptor_info_id);

	spv::Id live_status_id = build_ssbo_load_array(builder, builder.makeUintType(32),
	                                               global_buffer_id,
	                                               uint32_t(DescriptorQAGlobalMembers::LiveStatusTable),
	                                               cookie_shifted_id);
	spv::Id live_status_cond_id = build_live_check(builder, live_status_id, cookie_mask_id);

	spv::Id type_cond_id = build_binary_op(builder, builder.makeUintType(32), spv::OpBitwiseAnd, descriptor_info_id, descriptor_type_id);
	type_cond_id = build_binary_op(builder, builder.makeBoolType(), spv::OpIEqual,
	                               type_cond_id, descriptor_type_id);

	spv::Id out_of_range_id = build_binary_op(builder, builder.makeBoolType(), spv::OpUGreaterThanEqual,
	                                          offset_id, descriptor_count_id);

	// First check: descriptor index is in range of heap.
	auto range_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	range_check->addIdOperand(out_of_range_id);
	range_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_INDEX_OUT_OF_RANGE_BIT));
	range_check->addIdOperand(builder.makeUintConstant(0u));

	// Second: Check if type matches.
	auto type_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	type_check->addIdOperand(type_cond_id);
	type_check->addIdOperand(builder.makeUintConstant(0u));
	type_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_INVALID_TYPE_BIT));

	// Third: Check if cookie is alive.
	auto alive_check = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpSelect);
	alive_check->addIdOperand(live_status_cond_id);
	alive_check->addIdOperand(builder.makeUintConstant(0u));
	alive_check->addIdOperand(builder.makeUintConstant(DESCRIPTOR_QA_FAULT_RESOURCE_DESTROYED_BIT));

	auto merge_check0 = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpBitwiseOr);
	auto merge_check1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeUintType(32), spv::OpBitwiseOr);
	merge_check0->addIdOperand(range_check->getResultId());
	merge_check0->addIdOperand(type_check->getResultId());
	merge_check1->addIdOperand(merge_check0->getResultId());
	merge_check1->addIdOperand(alive_check->getResultId());

	auto fault_cond = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeBoolType(), spv::OpINotEqual);
	fault_cond->addIdOperand(merge_check1->getResultId());
	fault_cond->addIdOperand(builder.makeUintConstant(0u));

	spv::Id fault_type_id = merge_check1->getResultId();
	spv::Id fault_cond_id = fault_cond->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(range_check));
	builder.getBuildPoint()->addInstruction(std::move(type_check));
	builder.getBuildPoint()->addInstruction(std::move(alive_check));
	builder.getBuildPoint()->addInstruction(std::move(merge_check0));
	builder.getBuildPoint()->addInstruction(std::move(merge_check1));
	builder.getBuildPoint()->addInstruction(std::move(fault_cond));

	auto *fault_block = new spv::Block(builder.getUniqueId(), *func);
	auto *correct_block = new spv::Block(builder.getUniqueId(), *func);
	builder.createSelectionMerge(correct_block, 0);
	builder.createConditionalBranch(fault_cond_id, fault_block, correct_block);
	{
		builder.setBuildPoint(fault_block);
		auto call = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeVoidType(), spv::OpFunctionCall);
		call->addIdOperand(fault_func_id);
		call->addIdOperand(fault_type_id);
		call->addIdOperand(offset_id);
		call->addIdOperand(cookie_id);
		call->addIdOperand(heap_id);
		call->addIdOperand(descriptor_type_id);
		call->addIdOperand(descriptor_info_id);
		call->addIdOperand(instruction_id);
		builder.getBuildPoint()->addInstruction(std::move(call));
		builder.makeReturn(false, fallback_offset_id);
	}
	builder.setBuildPoint(correct_block);
	builder.makeReturn(false, offset_id);

	builder.setBuildPoint(current_build_point);
	return func->getId();
}